

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.cxx
# Opt level: O0

void cmWorkerPoolInternal::UVSlotBegin(uv_async_t *handle)

{
  vector<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>,_std::allocator<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>_>_>
  *this;
  reference this_00;
  pointer this_01;
  cmWorkerPoolInternal *local_58;
  code *local_50;
  undefined8 local_48;
  thread local_40;
  uint local_38 [2];
  uint ii_1;
  undefined1 local_28 [16];
  uint ii;
  uint num;
  cmWorkerPoolInternal *gint;
  uv_async_t *handle_local;
  
  _ii = (cmWorkerPoolInternal *)handle->data;
  gint = (cmWorkerPoolInternal *)handle;
  local_28._12_4_ = cmWorkerPool::ThreadCount(_ii->Pool);
  std::
  vector<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>,_std::allocator<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>_>_>
  ::reserve(&_ii->Workers,(ulong)(uint)local_28._12_4_);
  for (local_28._8_4_ = 0; local_28._8_4_ != local_28._12_4_; local_28._8_4_ = local_28._8_4_ + 1) {
    this = &_ii->Workers;
    std::unique_ptr<uv_loop_s,_std::default_delete<uv_loop_s>_>::operator*(&_ii->UVLoop);
    std::make_unique<cmWorkerPoolWorker,uv_loop_s&>((uv_loop_s *)local_28);
    std::
    vector<std::unique_ptr<cmWorkerPoolWorker,std::default_delete<cmWorkerPoolWorker>>,std::allocator<std::unique_ptr<cmWorkerPoolWorker,std::default_delete<cmWorkerPoolWorker>>>>
    ::emplace_back<std::unique_ptr<cmWorkerPoolWorker,std::default_delete<cmWorkerPoolWorker>>>
              ((vector<std::unique_ptr<cmWorkerPoolWorker,std::default_delete<cmWorkerPoolWorker>>,std::allocator<std::unique_ptr<cmWorkerPoolWorker,std::default_delete<cmWorkerPoolWorker>>>>
                *)this,(unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_> *)
                       local_28);
    std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>::~unique_ptr
              ((unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_> *)local_28)
    ;
  }
  for (local_38[0] = 0; local_38[0] != local_28._12_4_; local_38[0] = local_38[0] + 1) {
    this_00 = std::
              vector<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>,_std::allocator<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>_>_>
              ::operator[](&_ii->Workers,(ulong)local_38[0]);
    this_01 = std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>::
              operator->(this_00);
    local_50 = Work;
    local_48 = 0;
    local_58 = _ii;
    std::thread::
    thread<void(cmWorkerPoolInternal::*)(unsigned_int),cmWorkerPoolInternal*,unsigned_int&,void>
              (&local_40,(type *)&local_50,&local_58,local_38);
    cmWorkerPoolWorker::SetThread(this_01,&local_40);
    std::thread::~thread(&local_40);
  }
  ::cm::uv_handle_ptr_base_<uv_async_s>::reset
            ((uv_handle_ptr_base_<uv_async_s> *)&_ii->UVRequestBegin);
  return;
}

Assistant:

void cmWorkerPoolInternal::UVSlotBegin(uv_async_t* handle)
{
  auto& gint = *reinterpret_cast<cmWorkerPoolInternal*>(handle->data);
  // Create worker threads
  {
    unsigned int const num = gint.Pool->ThreadCount();
    // Create workers
    gint.Workers.reserve(num);
    for (unsigned int ii = 0; ii != num; ++ii) {
      gint.Workers.emplace_back(
        cm::make_unique<cmWorkerPoolWorker>(*gint.UVLoop));
    }
    // Start worker threads
    for (unsigned int ii = 0; ii != num; ++ii) {
      gint.Workers[ii]->SetThread(
        std::thread(&cmWorkerPoolInternal::Work, &gint, ii));
    }
  }
  // Destroy begin request
  gint.UVRequestBegin.reset();
}